

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupOrdered(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  Tim_Man_t *pTVar6;
  uint uVar7;
  int iVar8;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  iVar8 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar8;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar4;
  }
  Aig_ManCleanData(p);
  for (iVar8 = 0; iVar8 < p->vObjs->nSize; iVar8 = iVar8 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar8);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar7 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar1 = uVar7 & 7;
      if (uVar1 == 4) {
        pAVar5 = Aig_ObjChild0Copy(pObj);
      }
      else if ((uVar7 & 7) - 7 < 0xfffffffe) {
        if (uVar1 == 3) {
          pAVar5 = Aig_ObjChild0Copy(pObj);
          pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
        }
        else if (uVar1 == 2) {
          pAVar5 = Aig_ObjCreateCi(p_00);
          *(ulong *)&pAVar5->field_0x18 =
               *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
               *(ulong *)&pObj->field_0x18 & 0xffffff00000000;
        }
        else {
          iVar2 = Aig_ObjIsConst1(pObj);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                          ,0x13e,"Aig_Man_t *Aig_ManDupOrdered(Aig_Man_t *)");
          }
          pAVar5 = p_00->pConst1;
        }
      }
      else {
        pAVar5 = Aig_ObjChild0Copy(pObj);
        p1 = Aig_ObjChild1Copy(pObj);
        pAVar5 = Aig_Oper(p_00,pAVar5,p1,*(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID);
      }
      (pObj->field_5).pData = pAVar5;
    }
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x141,"Aig_Man_t *Aig_ManDupOrdered(Aig_Man_t *)");
  }
  uVar1 = Aig_ManCleanup(p_00);
  if (uVar1 != 0) {
    printf("Aig_ManDupOrdered(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar1);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar6 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar6;
  }
  iVar8 = Aig_ManCheck(p_00);
  if (iVar8 == 0) {
    puts("Aig_ManDupOrdered(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupOrdered( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        }
        else if ( Aig_ObjIsConst1(pObj) )
        {
            pObjNew = Aig_ManConst1(pNew);
        }
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupOrdered(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupOrdered(): The check has failed.\n" );
    return pNew;
}